

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O0

void __thiscall
serialize_tests::Base::Unserialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>
          (Base *this,ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *s)

{
  long lVar1;
  BaseFormat *pBVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  value_type *in_RDI;
  long in_FS_OFFSET;
  string hex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  Span<char> *in_stack_ffffffffffffff38;
  allocator<char> *local_a0;
  char *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  string_view in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar2 = ParamsStream<DataStream_&,_serialize_tests::BaseFormat>::
           GetParams<serialize_tests::BaseFormat>
                     ((ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *)
                      in_stack_ffffffffffffff28);
  if (pBVar2->m_base_format == RAW) {
    ParamsStream<DataStream&,serialize_tests::BaseFormat>::operator>>
              ((ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *)in_stack_ffffffffffffff38,
               (uchar *)in_stack_ffffffffffffff30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
    Span<char>::Span<std::__cxx11::string>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (in_stack_ffffffffffffff28);
    Span<char>::first(in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
    ParamsStream<DataStream&,serialize_tests::BaseFormat>::operator>>
              ((ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *)in_stack_ffffffffffffff38,
               (Span<char> *)in_stack_ffffffffffffff30);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
    TryParseHex<unsigned_char>(in_stack_ffffffffffffffb0);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffff38);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    *in_RDI = *pvVar3;
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        if (s.template GetParams<BaseFormat>().m_base_format == BaseFormat::RAW) {
            s >> m_base_data;
        } else {
            std::string hex{"aa"};
            s >> Span{hex}.first(hex.size());
            m_base_data = TryParseHex<uint8_t>(hex).value().at(0);
        }
    }